

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

void Vec_WrdSelectSortCost2(word *pArray,int nSize,word *pCosts)

{
  word wVar1;
  word t_1;
  word t;
  int local_28;
  int best_i;
  int j;
  int i;
  word *pCosts_local;
  int nSize_local;
  word *pArray_local;
  
  for (best_i = 0; best_i < nSize + -1; best_i = best_i + 1) {
    t._4_4_ = best_i;
    local_28 = best_i;
    while (local_28 = local_28 + 1, local_28 < nSize) {
      if (pCosts[local_28] < pCosts[t._4_4_]) {
        t._4_4_ = local_28;
      }
    }
    wVar1 = pArray[best_i];
    pArray[best_i] = pArray[t._4_4_];
    pArray[t._4_4_] = wVar1;
    wVar1 = pCosts[best_i];
    pCosts[best_i] = pCosts[t._4_4_];
    pCosts[t._4_4_] = wVar1;
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Prints distribution of operator types.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
static inline void Vec_WrdSelectSortCost2( word * pArray, int nSize, word * pCosts )
{
    int i, j, best_i;
    for ( i = 0; i < nSize-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nSize; j++ )
            if ( pCosts[j] < pCosts[best_i] )
                best_i = j;
        ABC_SWAP( word, pArray[i], pArray[best_i] );
        ABC_SWAP( word, pCosts[i], pCosts[best_i] );
    }
}